

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.cpp
# Opt level: O2

void __thiscall RNG_Double_Test::TestBody(RNG_Double_Test *this)

{
  char *message;
  int iVar1;
  bool bVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  double v;
  RNG rng;
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    v = pbrt::RNG::Uniform<double>(&rng);
    local_68.ptr_._0_4_ = (float)v;
    testing::internal::CmpHelperNE<double,float>
              ((internal *)&gtest_ar,"v","float(v)",&v,(float *)&local_68);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/rng_test.cpp"
                 ,0x76,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(RNG, Double) {
    RNG rng;
    for (int i = 0; i < 10; ++i) {
        double v = rng.Uniform<double>();
        EXPECT_NE(v, float(v));
    }
}